

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_datarate_test.cc
# Opt level: O0

void __thiscall
datarate_test::anon_unknown_0::DatarateTestSVC::
BasicRateTargetingSVC2TL1SLScreenDropFrame1920x1080Test(DatarateTestSVC *this)

{
  undefined1 uVar1;
  undefined1 uVar2;
  bool bVar3;
  ParamType *expr2;
  __tuple_element_t<4UL,_tuple<const_CodecFactory_*,_TestMode,_int,_unsigned_int,_int>_> *p_Var4;
  DatarateTestSVC *in_RDI;
  AssertionResult gtest_ar;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  int bitrate_array [2];
  Y4mVideoSource video;
  Y4mVideoSource *in_stack_fffffffffffffe60;
  int iVar5;
  undefined2 in_stack_fffffffffffffe6c;
  allocator *file;
  undefined4 in_stack_fffffffffffffe88;
  Type in_stack_fffffffffffffe8c;
  Y4mVideoSource *in_stack_fffffffffffffe90;
  AssertionResult local_160 [2];
  int local_13c;
  TestPartResultReporterInterface *in_stack_fffffffffffffed8;
  AssertHelper *this_00;
  allocator local_101;
  string local_100 [32];
  undefined1 local_e0 [224];
  
  (in_RDI->super_DatarateTest).super_EncoderTest.cfg_.rc_buf_initial_sz = 0x32;
  (in_RDI->super_DatarateTest).super_EncoderTest.cfg_.rc_buf_optimal_sz = 0x32;
  (in_RDI->super_DatarateTest).super_EncoderTest.cfg_.rc_buf_sz = 100;
  (in_RDI->super_DatarateTest).super_EncoderTest.cfg_.rc_dropframe_thresh = 0x1e;
  (in_RDI->super_DatarateTest).super_EncoderTest.cfg_.rc_min_quantizer = 0;
  (in_RDI->super_DatarateTest).super_EncoderTest.cfg_.rc_max_quantizer = 0x34;
  (in_RDI->super_DatarateTest).super_EncoderTest.cfg_.rc_end_usage = AOM_CBR;
  (in_RDI->super_DatarateTest).super_EncoderTest.cfg_.g_lag_in_frames = 0;
  (in_RDI->super_DatarateTest).super_EncoderTest.cfg_.g_error_resilient = 0;
  file = &local_101;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_100,"screendata.1920_1080.y4m",file);
  libaom_test::Y4mVideoSource::Y4mVideoSource
            (in_stack_fffffffffffffe90,
             (string *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
             (uint)((ulong)file >> 0x20),(int)file);
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator((allocator<char> *)&local_101);
  this_00 = (AssertHelper *)0x640000003c;
  expr2 = testing::
          WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>_>
          ::GetParam();
  p_Var4 = std::get<4ul,libaom_test::CodecFactory_const*,libaom_test::TestMode,int,unsigned_int,int>
                     ((tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>
                       *)0x7c96da);
  (in_RDI->super_DatarateTest).super_EncoderTest.cfg_.rc_target_bitrate =
       *(uint *)(local_100 + (long)*p_Var4 * 4 + -0x20);
  (*(in_RDI->super_CodecTestWith4Params<libaom_test::TestMode,_int,_unsigned_int,_int>).
    super_TestWithParam<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>_>
    .super_Test._vptr_Test[8])();
  in_RDI->screen_mode_ = 1;
  in_RDI->number_temporal_layers_ = 2;
  in_RDI->number_spatial_layers_ = 1;
  in_RDI->target_layer_bitrate_[0] =
       ((in_RDI->super_DatarateTest).super_EncoderTest.cfg_.rc_target_bitrate * 0x3c) / 100;
  in_RDI->target_layer_bitrate_[1] =
       (in_RDI->super_DatarateTest).super_EncoderTest.cfg_.rc_target_bitrate;
  uVar1 = testing::internal::AlwaysTrue();
  if ((bool)uVar1) {
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)in_stack_fffffffffffffe90);
    uVar2 = testing::internal::AlwaysTrue();
    if ((bool)uVar2) {
      (*(in_RDI->super_DatarateTest).super_EncoderTest._vptr_EncoderTest[2])
                (&in_RDI->super_DatarateTest,local_e0);
    }
    bVar3 = testing::internal::HasNewFatalFailureHelper::has_new_fatal_failure
                      ((HasNewFatalFailureHelper *)&stack0xfffffffffffffec8);
    if (bVar3) {
      local_13c = 2;
    }
    else {
      local_13c = 0;
    }
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)in_stack_fffffffffffffe60);
    if (local_13c == 0) {
      iVar5 = local_13c;
      GetMismatchFrames(in_RDI);
      testing::internal::CmpHelperLE<unsigned_int,unsigned_int>
                ((char *)in_RDI,(char *)expr2,
                 (uint *)CONCAT17(uVar1,CONCAT16(uVar2,CONCAT24(in_stack_fffffffffffffe6c,iVar5))),
                 (uint *)in_stack_fffffffffffffe60);
      iVar5 = (int)((ulong)in_RDI >> 0x20);
      bVar3 = testing::AssertionResult::operator_cast_to_bool(local_160);
      if (!bVar3) {
        testing::Message::Message((Message *)in_stack_fffffffffffffe90);
        in_stack_fffffffffffffe60 =
             (Y4mVideoSource *)
             testing::AssertionResult::failure_message((AssertionResult *)0x7c9984);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,(char *)file,
                   iVar5,(char *)expr2);
        testing::internal::AssertHelper::operator=(this_00,(Message *)in_stack_fffffffffffffed8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe60);
        testing::Message::~Message((Message *)0x7c99d2);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x7c9a34);
      local_13c = 0;
      goto LAB_007c9a3c;
    }
    if (local_13c != 2) goto LAB_007c9a3c;
  }
  iVar5 = (int)((ulong)in_RDI >> 0x20);
  testing::Message::Message((Message *)in_stack_fffffffffffffe90);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,(char *)file,iVar5,
             (char *)expr2);
  testing::internal::AssertHelper::operator=(this_00,(Message *)in_stack_fffffffffffffed8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe60);
  testing::Message::~Message((Message *)0x7c98cf);
  local_13c = 1;
LAB_007c9a3c:
  libaom_test::Y4mVideoSource::~Y4mVideoSource(in_stack_fffffffffffffe60);
  return;
}

Assistant:

virtual void BasicRateTargetingSVC2TL1SLScreenDropFrame1920x1080Test() {
    cfg_.rc_buf_initial_sz = 50;
    cfg_.rc_buf_optimal_sz = 50;
    cfg_.rc_buf_sz = 100;
    cfg_.rc_dropframe_thresh = 30;
    cfg_.rc_min_quantizer = 0;
    cfg_.rc_max_quantizer = 52;
    cfg_.rc_end_usage = AOM_CBR;
    cfg_.g_lag_in_frames = 0;
    cfg_.g_error_resilient = 0;

    ::libaom_test::Y4mVideoSource video("screendata.1920_1080.y4m", 0, 60);

    const int bitrate_array[2] = { 60, 100 };
    cfg_.rc_target_bitrate = bitrate_array[GET_PARAM(4)];
    ResetModel();
    screen_mode_ = 1;
    number_temporal_layers_ = 2;
    number_spatial_layers_ = 1;
    target_layer_bitrate_[0] = 60 * cfg_.rc_target_bitrate / 100;
    target_layer_bitrate_[1] = cfg_.rc_target_bitrate;
    ASSERT_NO_FATAL_FAILURE(RunLoop(&video));
#if CONFIG_AV1_DECODER
    // Top temporal layers are non_reference, so exclude them from
    // mismatch count, since loopfilter/cdef is not applied for these on
    // encoder side, but is always applied on decoder.
    // This means 150 = #frames(300) - #TL2_frames(150).
    // We use LE for screen since loopfilter level can become very small
    // or zero and then the frame is not a mismatch.
    EXPECT_LE(GetMismatchFrames(), 150u);
#endif
  }